

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

void __thiscall
google::protobuf::UninterpretedOption_NamePart::Clear(UninterpretedOption_NamePart *this)

{
  bool bVar1;
  string *default_value;
  LogMessage *other;
  LogFinisher local_7d [20];
  byte local_69;
  LogMessage local_68;
  UninterpretedOption_NamePart *local_30;
  UninterpretedOption_NamePart *this_local;
  InternalMetadataWithArena *local_20;
  InternalMetadataWithArena *local_18;
  InternalMetadataWithArena *local_10;
  
  local_30 = this;
  bVar1 = has_name_part(this);
  if (bVar1) {
    default_value = internal::GetEmptyStringAlreadyInited_abi_cxx11_();
    bVar1 = internal::ArenaStringPtr::IsDefault(&this->name_part_,default_value);
    local_69 = 0;
    if (bVar1) {
      internal::LogMessage::LogMessage
                (&local_68,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/descriptor.pb.cc"
                 ,0x3341);
      local_69 = 1;
      other = internal::LogMessage::operator<<
                        (&local_68,
                         "CHECK failed: !name_part_.IsDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited()): "
                        );
      internal::LogFinisher::operator=(local_7d,other);
    }
    if ((local_69 & 1) != 0) {
      internal::LogMessage::~LogMessage(&local_68);
    }
    internal::ArenaStringPtr::UnsafeRawStringPointer_abi_cxx11_(&this->name_part_);
    std::__cxx11::string::clear();
  }
  this->is_extension_ = false;
  this_local = (UninterpretedOption_NamePart *)&this->_has_bits_;
  memset(this_local,0,4);
  local_20 = &this->_internal_metadata_;
  if (((uint)(local_20->
             super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
             ).ptr_ & 1) == 1) {
    local_18 = local_20;
    local_10 = local_20;
    internal::InternalMetadataWithArena::DoClear(local_20);
  }
  return;
}

Assistant:

void UninterpretedOption_NamePart::Clear() {
// @@protoc_insertion_point(message_clear_start:google.protobuf.UninterpretedOption.NamePart)
  if (has_name_part()) {
    GOOGLE_DCHECK(!name_part_.IsDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited()));
    (*name_part_.UnsafeRawStringPointer())->clear();
  }
  is_extension_ = false;
  _has_bits_.Clear();
  _internal_metadata_.Clear();
}